

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

size_t doh_write_cb(void *contents,size_t size,size_t nmemb,void *userp)

{
  void *pvVar1;
  dohresponse *mem;
  size_t realsize;
  void *userp_local;
  size_t nmemb_local;
  size_t size_local;
  void *contents_local;
  
  contents_local = (void *)(size * nmemb);
  if ((ulong)(*(long *)((long)userp + 8) + (long)contents_local) < 0xbb9) {
    pvVar1 = Curl_saferealloc(*userp,*(long *)((long)userp + 8) + (long)contents_local);
    *(void **)userp = pvVar1;
    if (*userp == 0) {
      contents_local = (void *)0x0;
    }
    else {
      memcpy((void *)(*userp + *(long *)((long)userp + 8)),contents,(size_t)contents_local);
      *(long *)((long)userp + 8) = (long)contents_local + *(long *)((long)userp + 8);
    }
  }
  else {
    contents_local = (void *)0x0;
  }
  return (size_t)contents_local;
}

Assistant:

static size_t
doh_write_cb(void *contents, size_t size, size_t nmemb, void *userp)
{
  size_t realsize = size * nmemb;
  struct dohresponse *mem = (struct dohresponse *)userp;

  if((mem->size + realsize) > DOH_MAX_RESPONSE_SIZE)
    /* suspiciously much for us */
    return 0;

  mem->memory = Curl_saferealloc(mem->memory, mem->size + realsize);
  if(!mem->memory)
    /* out of memory! */
    return 0;

  memcpy(&(mem->memory[mem->size]), contents, realsize);
  mem->size += realsize;

  return realsize;
}